

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampTest::verifyTextureSampleResult
          (TextureBorderClampTest *this,ConstPixelBufferAccess *renderedFrame,float *texCoord,
          ReferenceParams *samplerParams,LodPrecision *lodPrecision,LookupPrecision *lookupPrecision
          )

{
  int iVar1;
  int iVar2;
  RenderTarget *this_00;
  PixelFormat *pPVar3;
  Texture2D *pTVar4;
  Texture2D *pTVar5;
  qpWatchDog *watchDog;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  bool bVar8;
  Texture2DView TVar9;
  allocator<char> local_5c1;
  string local_5c0;
  allocator<char> local_599;
  string local_598;
  LogImage local_578;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  LogImage local_498;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  LogImage local_3b8;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  LogImageSet local_2d8;
  MessageBuilder local_298;
  Texture2DView local_118;
  PixelBufferAccess local_108;
  ConstPixelBufferAccess local_e0;
  Texture2DView local_b8;
  SurfaceAccess local_a8;
  int local_88 [2];
  int numFailedPixels;
  undefined1 local_78 [8];
  Surface errorMask;
  Surface reference;
  PixelFormat pixelFormat;
  LookupPrecision *lookupPrecision_local;
  LodPrecision *lodPrecision_local;
  ReferenceParams *samplerParams_local;
  float *texCoord_local;
  ConstPixelBufferAccess *renderedFrame_local;
  TextureBorderClampTest *this_local;
  
  this_00 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar3 = tcu::RenderTarget::getPixelFormat(this_00);
  reference.m_pixels.m_cap._0_4_ = pPVar3->redBits;
  reference.m_pixels.m_cap._4_4_ = pPVar3->greenBits;
  iVar1 = tcu::ConstPixelBufferAccess::getWidth(renderedFrame);
  iVar2 = tcu::ConstPixelBufferAccess::getHeight(renderedFrame);
  tcu::Surface::Surface((Surface *)&errorMask.m_pixels.m_cap,iVar1,iVar2);
  iVar1 = tcu::ConstPixelBufferAccess::getWidth(renderedFrame);
  iVar2 = tcu::ConstPixelBufferAccess::getHeight(renderedFrame);
  tcu::Surface::Surface((Surface *)local_78,iVar1,iVar2);
  tcu::SurfaceAccess::SurfaceAccess
            (&local_a8,(Surface *)&errorMask.m_pixels.m_cap,(PixelFormat *)&reference.m_pixels.m_cap
            );
  pTVar4 = de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::operator->
                     (&(this->m_texture).
                       super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>);
  pTVar5 = glu::Texture2D::getRefTexture(pTVar4);
  TVar9 = tcu::Texture2D::operator_cast_to_Texture2DView(pTVar5);
  local_b8.m_levels = TVar9.m_levels;
  local_b8.m_numLevels = TVar9.m_numLevels;
  glu::TextureTestUtil::sampleTexture(&local_a8,&local_b8,texCoord,samplerParams);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_e0,(Surface *)&errorMask.m_pixels.m_cap);
  tcu::Surface::getAccess(&local_108,(Surface *)local_78);
  pTVar4 = de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::operator->
                     (&(this->m_texture).
                       super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>);
  pTVar5 = glu::Texture2D::getRefTexture(pTVar4);
  TVar9 = tcu::Texture2D::operator_cast_to_Texture2DView(pTVar5);
  local_118.m_levels = TVar9.m_levels;
  local_118.m_numLevels = TVar9.m_numLevels;
  watchDog = tcu::TestContext::getWatchDog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  local_88[0] = glu::TextureTestUtil::computeTextureLookupDiff
                          (renderedFrame,&local_e0,&local_108,&local_118,texCoord,samplerParams,
                           lookupPrecision,lodPrecision,watchDog);
  if (0 < local_88[0]) {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_298,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_298,(char (*) [40])"ERROR: Result verification failed, got ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_88);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])" invalid pixels!");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_298);
  }
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"VerifyResult",&local_2f9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_320,"Verification result",&local_321);
  tcu::LogImageSet::LogImageSet(&local_2d8,&local_2f8,&local_320);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"Rendered",&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"Rendered image",&local_401);
  tcu::LogImage::LogImage
            (&local_3b8,&local_3d8,&local_400,renderedFrame,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar6,&local_3b8);
  tcu::LogImage::~LogImage(&local_3b8);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  tcu::LogImageSet::~LogImageSet(&local_2d8);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  if (0 < local_88[0]) {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"Reference",&local_4b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e0,"Ideal reference image",&local_4e1);
    tcu::LogImage::LogImage
              (&local_498,&local_4b8,&local_4e0,(Surface *)&errorMask.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_498);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,"ErrorMask",&local_599);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c0,"Error mask",&local_5c1)
    ;
    tcu::LogImage::LogImage
              (&local_578,&local_598,&local_5c0,(Surface *)local_78,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(pTVar6,&local_578);
    tcu::LogImage::~LogImage(&local_578);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::allocator<char>::~allocator(&local_5c1);
    std::__cxx11::string::~string((string *)&local_598);
    std::allocator<char>::~allocator(&local_599);
    tcu::LogImage::~LogImage(&local_498);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::allocator<char>::~allocator(&local_4e1);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator(&local_4b9);
  }
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(pTVar6,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  bVar8 = local_88[0] == 0;
  tcu::Surface::~Surface((Surface *)local_78);
  tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
  return bVar8;
}

Assistant:

bool TextureBorderClampTest::verifyTextureSampleResult (const tcu::ConstPixelBufferAccess&				renderedFrame,
														const float*									texCoord,
														const glu::TextureTestUtil::ReferenceParams&	samplerParams,
														const tcu::LodPrecision&						lodPrecision,
													    const tcu::LookupPrecision&						lookupPrecision)
{
	const tcu::PixelFormat			pixelFormat			= m_context.getRenderTarget().getPixelFormat();
	tcu::Surface					reference			(renderedFrame.getWidth(), renderedFrame.getHeight());
	tcu::Surface					errorMask			(renderedFrame.getWidth(), renderedFrame.getHeight());
	int								numFailedPixels;

	glu::TextureTestUtil::sampleTexture(tcu::SurfaceAccess(reference, pixelFormat), m_texture->getRefTexture(), texCoord, samplerParams);

	numFailedPixels = glu::TextureTestUtil::computeTextureLookupDiff(renderedFrame, reference.getAccess(), errorMask.getAccess(), m_texture->getRefTexture(),
																	 texCoord, samplerParams, lookupPrecision, lodPrecision, m_testCtx.getWatchDog());

	if (numFailedPixels > 0)
		m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Result verification failed, got " << numFailedPixels << " invalid pixels!" << tcu::TestLog::EndMessage;
	m_testCtx.getLog()	<< tcu::TestLog::ImageSet("VerifyResult", "Verification result")
						<< tcu::TestLog::Image("Rendered", "Rendered image", renderedFrame);
	if (numFailedPixels > 0)
	{
		m_testCtx.getLog()	<< tcu::TestLog::Image("Reference", "Ideal reference image", reference)
							<< tcu::TestLog::Image("ErrorMask", "Error mask", errorMask);
	}
	m_testCtx.getLog() << tcu::TestLog::EndImageSet;

	return (numFailedPixels == 0);
}